

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool anon_unknown.dwarf_3dd27a::ExpandMacros<cmCMakePresetsGraph::PackagePreset>
               (cmCMakePresetsGraph *graph,PackagePreset *preset,
               optional<cmCMakePresetsGraph::PackagePreset> *out)

{
  bool bVar1;
  int version;
  ExpandMacroResult EVar2;
  uint uVar3;
  PackagePreset *pPVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pmVar5;
  reference __k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  mapped_type *pmVar6;
  element_type *peVar7;
  bool *pbVar8;
  optional<bool> local_12e;
  undefined4 local_12c;
  optional<bool> result;
  reference ppStack_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v_1;
  iterator __end0_1;
  iterator __begin0_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2_1;
  optional<cmCMakePresetsGraph::PackagePreset> *local_100;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  *local_f8;
  undefined1 local_f0 [8];
  MacroExpander environmentMacroExpander;
  undefined1 local_c0 [8];
  MacroExpander defaultMacroExpander;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  macroExpanders;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  iterator __end0;
  iterator __begin0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  envCycles;
  optional<cmCMakePresetsGraph::PackagePreset> *out_local;
  PackagePreset *preset_local;
  cmCMakePresetsGraph *graph_local;
  
  envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)out;
  std::optional<cmCMakePresetsGraph::PackagePreset>::
  emplace<cmCMakePresetsGraph::PackagePreset_const&>(out,preset);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
         *)&__range2);
  pPVar4 = std::optional<cmCMakePresetsGraph::PackagePreset>::operator->
                     ((optional<cmCMakePresetsGraph::PackagePreset> *)
                      envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pmVar5 = &(pPVar4->super_Preset).Environment;
  __end0 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(pmVar5);
  v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end(pmVar5);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&v), bVar1) {
    __k = std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                           *)&__range2,&__k->first);
    *pmVar6 = Unvisited;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
            *)&defaultMacroExpander._M_invoker);
  environmentMacroExpander._M_invoker = (_Invoker_type)graph;
  std::
  function<cmCMakePresetsGraphInternal::ExpandMacroResult(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&,int)>
  ::
  function<(anonymous_namespace)::ExpandMacros<cmCMakePresetsGraph::PackagePreset>(cmCMakePresetsGraph_const&,cmCMakePresetsGraph::PackagePreset_const&,std::optional<cmCMakePresetsGraph::PackagePreset>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&,int)_1_,void>
            ((function<cmCMakePresetsGraphInternal::ExpandMacroResult(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&,int)>
              *)local_c0,(anon_class_16_2_fd1d9848 *)&environmentMacroExpander._M_invoker);
  local_100 = (optional<cmCMakePresetsGraph::PackagePreset> *)
              envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_f8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              *)&__range2;
  __range2_1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&defaultMacroExpander._M_invoker;
  std::
  function<cmCMakePresetsGraphInternal::ExpandMacroResult(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&,int)>
  ::
  function<(anonymous_namespace)::ExpandMacros<cmCMakePresetsGraph::PackagePreset>(cmCMakePresetsGraph_const&,cmCMakePresetsGraph::PackagePreset_const&,std::optional<cmCMakePresetsGraph::PackagePreset>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&,int)_2_,void>
            ((function<cmCMakePresetsGraphInternal::ExpandMacroResult(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&,int)>
              *)local_f0,(anon_class_24_3_1cf864a1 *)&__range2_1);
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)&defaultMacroExpander._M_invoker,(value_type *)local_c0);
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)&defaultMacroExpander._M_invoker,(value_type *)local_f0);
  pPVar4 = std::optional<cmCMakePresetsGraph::PackagePreset>::operator->
                     ((optional<cmCMakePresetsGraph::PackagePreset> *)
                      envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pmVar5 = &(pPVar4->super_Preset).Environment;
  __end0_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin(pmVar5);
  v_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::end(pmVar5);
  while (bVar1 = std::operator!=(&__end0_1,(_Self *)&v_1), bVar1) {
    ppStack_128 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end0_1);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&ppStack_128->second);
    if (bVar1) {
      value = std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&ppStack_128->second);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                             *)&__range2,&ppStack_128->first);
      version = cmCMakePresetsGraph::GetVersion(graph,&preset->super_Preset);
      EVar2 = VisitEnv(value,pmVar6,
                       (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                        *)&defaultMacroExpander._M_invoker,version);
      if (EVar2 != Ok) {
        if (EVar2 == Ignore) {
          std::optional<cmCMakePresetsGraph::PackagePreset>::reset
                    ((optional<cmCMakePresetsGraph::PackagePreset> *)
                     envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
          graph_local._7_1_ = true;
          goto LAB_002e5a48;
        }
        if (EVar2 == Error) {
          graph_local._7_1_ = false;
          goto LAB_002e5a48;
        }
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end0_1);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)&(preset->super_Preset).ConditionEvaluator);
  if (bVar1) {
    std::optional<bool>::optional(&local_12e);
    peVar7 = std::
             __shared_ptr_access<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(preset->super_Preset).ConditionEvaluator);
    uVar3 = cmCMakePresetsGraph::GetVersion(graph,&preset->super_Preset);
    uVar3 = (*peVar7->_vptr_Condition[2])
                      (peVar7,&defaultMacroExpander._M_invoker,(ulong)uVar3,&local_12e);
    if ((uVar3 & 1) == 0) {
      graph_local._7_1_ = false;
      goto LAB_002e5a48;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_12e);
    if (!bVar1) {
      std::optional<cmCMakePresetsGraph::PackagePreset>::reset
                ((optional<cmCMakePresetsGraph::PackagePreset> *)
                 envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
      graph_local._7_1_ = true;
      goto LAB_002e5a48;
    }
    pbVar8 = std::optional<bool>::operator*(&local_12e);
    bVar1 = *pbVar8;
    pPVar4 = std::optional<cmCMakePresetsGraph::PackagePreset>::operator->
                       ((optional<cmCMakePresetsGraph::PackagePreset> *)
                        envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    (pPVar4->super_Preset).ConditionResult = (bool)(bVar1 & 1);
  }
  graph_local._7_1_ =
       ExpandMacros(graph,preset,
                    (optional<cmCMakePresetsGraph::PackagePreset> *)
                    envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                     *)&defaultMacroExpander._M_invoker);
LAB_002e5a48:
  local_12c = 1;
  std::
  function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>
  ::~function((function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>
               *)local_f0);
  std::
  function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>
  ::~function((function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>
               *)local_c0);
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
             *)&defaultMacroExpander._M_invoker);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          *)&__range2);
  return graph_local._7_1_;
}

Assistant:

bool ExpandMacros(const cmCMakePresetsGraph& graph, const T& preset,
                  cm::optional<T>& out)
{
  out.emplace(preset);

  std::map<std::string, CycleStatus> envCycles;
  for (auto const& v : out->Environment) {
    envCycles[v.first] = CycleStatus::Unvisited;
  }

  std::vector<MacroExpander> macroExpanders;

  MacroExpander defaultMacroExpander =
    [&graph, &preset](const std::string& macroNamespace,
                      const std::string& macroName, std::string& macroOut,
                      int version) -> ExpandMacroResult {
    if (macroNamespace.empty()) {
      if (macroName == "sourceDir") {
        macroOut += graph.SourceDir;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "sourceParentDir") {
        macroOut += cmSystemTools::GetParentDirectory(graph.SourceDir);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "sourceDirName") {
        macroOut += cmSystemTools::GetFilenameName(graph.SourceDir);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "presetName") {
        macroOut += preset.Name;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "generator") {
        // Generator only makes sense if preset is not hidden.
        if (!preset.Hidden) {
          macroOut += graph.GetGeneratorForPreset(preset.Name);
        }
        return ExpandMacroResult::Ok;
      }
      if (macroName == "dollar") {
        macroOut += '$';
        return ExpandMacroResult::Ok;
      }
      if (macroName == "hostSystemName") {
        if (version < 3) {
          return ExpandMacroResult::Error;
        }
        macroOut += cmSystemTools::GetSystemName();
        return ExpandMacroResult::Ok;
      }
      if (macroName == "fileDir") {
        if (version < 4) {
          return ExpandMacroResult::Error;
        }
        macroOut +=
          cmSystemTools::GetParentDirectory(preset.OriginFile->Filename);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "pathListSep") {
        if (version < 5) {
          return ExpandMacroResult::Error;
        }
        macroOut += cmSystemTools::GetSystemPathlistSeparator();
        return ExpandMacroResult::Ok;
      }
    }

    return ExpandMacroResult::Ignore;
  };

  MacroExpander environmentMacroExpander =
    [&macroExpanders, &out, &envCycles](
      const std::string& macroNamespace, const std::string& macroName,
      std::string& result, int version) -> ExpandMacroResult {
    if (macroNamespace == "env" && !macroName.empty() && out) {
      auto v = out->Environment.find(macroName);
      if (v != out->Environment.end() && v->second) {
        auto e =
          VisitEnv(*v->second, envCycles[macroName], macroExpanders, version);
        if (e != ExpandMacroResult::Ok) {
          return e;
        }
        result += *v->second;
        return ExpandMacroResult::Ok;
      }
    }

    if (macroNamespace == "env" || macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      const char* value = std::getenv(macroName.c_str());
      if (value) {
        result += value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  };

  macroExpanders.push_back(defaultMacroExpander);
  macroExpanders.push_back(environmentMacroExpander);

  for (auto& v : out->Environment) {
    if (v.second) {
      switch (VisitEnv(*v.second, envCycles[v.first], macroExpanders,
                       graph.GetVersion(preset))) {
        case ExpandMacroResult::Error:
          return false;
        case ExpandMacroResult::Ignore:
          out.reset();
          return true;
        case ExpandMacroResult::Ok:
          break;
      }
    }
  }

  if (preset.ConditionEvaluator) {
    cm::optional<bool> result;
    if (!preset.ConditionEvaluator->Evaluate(
          macroExpanders, graph.GetVersion(preset), result)) {
      return false;
    }
    if (!result) {
      out.reset();
      return true;
    }
    out->ConditionResult = *result;
  }

  return ExpandMacros(graph, preset, out, macroExpanders);
}